

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

void __thiscall inja::Lexer::start(Lexer *this,string_view input)

{
  string_view view;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_t local_50;
  char *local_48;
  string_view local_40;
  size_t local_30;
  char *local_28;
  Lexer *local_20;
  Lexer *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (Lexer *)input._M_len;
  (this->m_in)._M_len = (size_t)this_local;
  (this->m_in)._M_str = (char *)input_local._M_len;
  this->tok_start = 0;
  this->pos = 0;
  this->state = Text;
  this->minus_state = Number;
  local_30 = (this->m_in)._M_len;
  local_28 = (this->m_in)._M_str;
  local_20 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,anon_var_dwarf_725d2);
  view._M_str = local_28;
  view._M_len = local_30;
  bVar1 = string_view::starts_with(view,local_40);
  if (bVar1) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&this->m_in,3,0xffffffffffffffff);
    local_50 = bVar2._M_len;
    (this->m_in)._M_len = local_50;
    local_48 = bVar2._M_str;
    (this->m_in)._M_str = local_48;
  }
  return;
}

Assistant:

void start(std::string_view input) {
    m_in = input;
    tok_start = 0;
    pos = 0;
    state = State::Text;
    minus_state = MinusState::Number;

    // Consume byte order mark (BOM) for UTF-8
    if (inja::string_view::starts_with(m_in, "\xEF\xBB\xBF")) {
      m_in = m_in.substr(3);
    }
  }